

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_dec_clnpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,OPJ_UINT32 ci
               ,OPJ_UINT32 vsc)

{
  char cVar1;
  byte bVar2;
  OPJ_UINT32 lu_00;
  uint uVar3;
  uint *puVar4;
  int local_70;
  opj_flag_t *south;
  opj_flag_t *north;
  OPJ_UINT32 l_c_3;
  OPJ_UINT32 l_c_2;
  OPJ_UINT32 lu;
  OPJ_UINT32 l_c_1;
  OPJ_UINT32 l_c;
  OPJ_UINT32 ctxt1;
  opj_mqc_t *mqc;
  OPJ_UINT32 v;
  OPJ_UINT32 vsc_local;
  OPJ_UINT32 ci_local;
  OPJ_INT32 oneplushalf_local;
  OPJ_INT32 *datap_local;
  opj_flag_t *flagsp_local;
  opj_t1_t *t1_local;
  
  cVar1 = (char)ci;
  if ((*flagsp & 0x200010 << (cVar1 * '\x03' & 0x1fU)) == 0) {
    bVar2 = opj_t1_getctxno_zc(&t1->mqc,*flagsp >> (cVar1 * '\x03' & 0x1fU));
    (t1->mqc).curctx = (t1->mqc).ctxs + bVar2;
    (t1->mqc).a = (t1->mqc).a - (*(t1->mqc).curctx)->qeval;
    if ((t1->mqc).c >> 0x10 < (*(t1->mqc).curctx)->qeval) {
      if ((t1->mqc).a < (*(t1->mqc).curctx)->qeval) {
        (t1->mqc).a = (*(t1->mqc).curctx)->qeval;
        mqc._0_4_ = (*(t1->mqc).curctx)->mps;
        *(t1->mqc).curctx = (*(t1->mqc).curctx)->nmps;
      }
      else {
        (t1->mqc).a = (*(t1->mqc).curctx)->qeval;
        mqc._0_4_ = (OPJ_UINT32)(((*(t1->mqc).curctx)->mps != 0 ^ 0xffU) & 1);
        *(t1->mqc).curctx = (*(t1->mqc).curctx)->nlps;
      }
      do {
        if ((t1->mqc).ct == 0) {
          uVar3 = (uint)(t1->mqc).bp[1];
          if (*(t1->mqc).bp == 0xff) {
            if (uVar3 < 0x90) {
              (t1->mqc).bp = (t1->mqc).bp + 1;
              (t1->mqc).c = uVar3 * 0x200 + (t1->mqc).c;
              (t1->mqc).ct = 7;
            }
            else {
              (t1->mqc).c = (t1->mqc).c + 0xff00;
              (t1->mqc).ct = 8;
              (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
            }
          }
          else {
            (t1->mqc).bp = (t1->mqc).bp + 1;
            (t1->mqc).c = uVar3 * 0x100 + (t1->mqc).c;
            (t1->mqc).ct = 8;
          }
        }
        (t1->mqc).a = (t1->mqc).a << 1;
        (t1->mqc).c = (t1->mqc).c << 1;
        (t1->mqc).ct = (t1->mqc).ct - 1;
      } while ((t1->mqc).a < 0x8000);
    }
    else {
      (t1->mqc).c = (t1->mqc).c + (*(t1->mqc).curctx)->qeval * -0x10000;
      if (((t1->mqc).a & 0x8000) == 0) {
        if ((t1->mqc).a < (*(t1->mqc).curctx)->qeval) {
          mqc._0_4_ = (OPJ_UINT32)(((*(t1->mqc).curctx)->mps != 0 ^ 0xffU) & 1);
          *(t1->mqc).curctx = (*(t1->mqc).curctx)->nlps;
        }
        else {
          mqc._0_4_ = (*(t1->mqc).curctx)->mps;
          *(t1->mqc).curctx = (*(t1->mqc).curctx)->nmps;
        }
        do {
          if ((t1->mqc).ct == 0) {
            uVar3 = (uint)(t1->mqc).bp[1];
            if (*(t1->mqc).bp == 0xff) {
              if (uVar3 < 0x90) {
                (t1->mqc).bp = (t1->mqc).bp + 1;
                (t1->mqc).c = uVar3 * 0x200 + (t1->mqc).c;
                (t1->mqc).ct = 7;
              }
              else {
                (t1->mqc).c = (t1->mqc).c + 0xff00;
                (t1->mqc).ct = 8;
                (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
              }
            }
            else {
              (t1->mqc).bp = (t1->mqc).bp + 1;
              (t1->mqc).c = uVar3 * 0x100 + (t1->mqc).c;
              (t1->mqc).ct = 8;
            }
          }
          (t1->mqc).a = (t1->mqc).a << 1;
          (t1->mqc).c = (t1->mqc).c << 1;
          (t1->mqc).ct = (t1->mqc).ct - 1;
        } while ((t1->mqc).a < 0x8000);
      }
      else {
        mqc._0_4_ = (*(t1->mqc).curctx)->mps;
      }
    }
    if ((OPJ_UINT32)mqc != 0) {
      lu_00 = opj_t1_getctxtno_sc_or_spb_index(*flagsp,flagsp[-1],flagsp[1],ci);
      bVar2 = opj_t1_getctxno_sc(lu_00);
      (t1->mqc).curctx = (t1->mqc).ctxs + bVar2;
      (t1->mqc).a = (t1->mqc).a - (*(t1->mqc).curctx)->qeval;
      if ((t1->mqc).c >> 0x10 < (*(t1->mqc).curctx)->qeval) {
        if ((t1->mqc).a < (*(t1->mqc).curctx)->qeval) {
          (t1->mqc).a = (*(t1->mqc).curctx)->qeval;
          mqc._0_4_ = (*(t1->mqc).curctx)->mps;
          *(t1->mqc).curctx = (*(t1->mqc).curctx)->nmps;
        }
        else {
          (t1->mqc).a = (*(t1->mqc).curctx)->qeval;
          mqc._0_4_ = (OPJ_UINT32)(((*(t1->mqc).curctx)->mps != 0 ^ 0xffU) & 1);
          *(t1->mqc).curctx = (*(t1->mqc).curctx)->nlps;
        }
        do {
          if ((t1->mqc).ct == 0) {
            uVar3 = (uint)(t1->mqc).bp[1];
            if (*(t1->mqc).bp == 0xff) {
              if (uVar3 < 0x90) {
                (t1->mqc).bp = (t1->mqc).bp + 1;
                (t1->mqc).c = uVar3 * 0x200 + (t1->mqc).c;
                (t1->mqc).ct = 7;
              }
              else {
                (t1->mqc).c = (t1->mqc).c + 0xff00;
                (t1->mqc).ct = 8;
                (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
              }
            }
            else {
              (t1->mqc).bp = (t1->mqc).bp + 1;
              (t1->mqc).c = uVar3 * 0x100 + (t1->mqc).c;
              (t1->mqc).ct = 8;
            }
          }
          (t1->mqc).a = (t1->mqc).a << 1;
          (t1->mqc).c = (t1->mqc).c << 1;
          (t1->mqc).ct = (t1->mqc).ct - 1;
        } while ((t1->mqc).a < 0x8000);
      }
      else {
        (t1->mqc).c = (t1->mqc).c + (*(t1->mqc).curctx)->qeval * -0x10000;
        if (((t1->mqc).a & 0x8000) == 0) {
          if ((t1->mqc).a < (*(t1->mqc).curctx)->qeval) {
            mqc._0_4_ = (OPJ_UINT32)(((*(t1->mqc).curctx)->mps != 0 ^ 0xffU) & 1);
            *(t1->mqc).curctx = (*(t1->mqc).curctx)->nlps;
          }
          else {
            mqc._0_4_ = (*(t1->mqc).curctx)->mps;
            *(t1->mqc).curctx = (*(t1->mqc).curctx)->nmps;
          }
          do {
            if ((t1->mqc).ct == 0) {
              uVar3 = (uint)(t1->mqc).bp[1];
              if (*(t1->mqc).bp == 0xff) {
                if (uVar3 < 0x90) {
                  (t1->mqc).bp = (t1->mqc).bp + 1;
                  (t1->mqc).c = uVar3 * 0x200 + (t1->mqc).c;
                  (t1->mqc).ct = 7;
                }
                else {
                  (t1->mqc).c = (t1->mqc).c + 0xff00;
                  (t1->mqc).ct = 8;
                  (t1->mqc).end_of_byte_stream_counter = (t1->mqc).end_of_byte_stream_counter + 1;
                }
              }
              else {
                (t1->mqc).bp = (t1->mqc).bp + 1;
                (t1->mqc).c = uVar3 * 0x100 + (t1->mqc).c;
                (t1->mqc).ct = 8;
              }
            }
            (t1->mqc).a = (t1->mqc).a << 1;
            (t1->mqc).c = (t1->mqc).c << 1;
            (t1->mqc).ct = (t1->mqc).ct - 1;
          } while ((t1->mqc).a < 0x8000);
        }
        else {
          mqc._0_4_ = (*(t1->mqc).curctx)->mps;
        }
      }
      bVar2 = opj_t1_getspb(lu_00);
      uVar3 = (OPJ_UINT32)mqc ^ bVar2;
      local_70 = oneplushalf;
      if (uVar3 != 0) {
        local_70 = -oneplushalf;
      }
      *datap = local_70;
      flagsp[-1] = 0x20 << (cVar1 * '\x03' & 0x1fU) | flagsp[-1];
      *flagsp = (uVar3 << 0x13 | 0x10) << (cVar1 * '\x03' & 0x1fU) | *flagsp;
      flagsp[1] = 8 << (cVar1 * '\x03' & 0x1fU) | flagsp[1];
      if ((ci == 0) && (vsc == 0)) {
        puVar4 = flagsp + -(ulong)(t1->w + 2);
        *puVar4 = uVar3 << 0x1f | 0x10000 | *puVar4;
        puVar4[-1] = puVar4[-1] | 0x20000;
        puVar4[1] = puVar4[1] | 0x8000;
      }
      if (ci == 3) {
        puVar4 = flagsp + (t1->w + 2);
        *puVar4 = uVar3 << 0x12 | 2 | *puVar4;
        puVar4[-1] = puVar4[-1] | 4;
        puVar4[1] = puVar4[1] | 1;
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_clnpass_step(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 ci,
    OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */
    opj_t1_dec_clnpass_step_macro(OPJ_TRUE, OPJ_FALSE,
                                  *flagsp, flagsp, t1->w + 2U, datap,
                                  0, ci, mqc, mqc->curctx,
                                  v, mqc->a, mqc->c, mqc->ct, oneplushalf, vsc);
}